

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O2

int __thiscall multicaldate_t::weekno(multicaldate_t *this,int weekday)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  caldate_t jan1;
  
  iVar1 = (*this->_vptr_multicaldate_t[7])();
  caldate_t::set_dayno(&jan1,iVar1);
  iVar1 = caldate_t::weekday(&jan1);
  iVar2 = caldate_t::dayno(&jan1);
  iVar3 = (*this->_vptr_multicaldate_t[2])(this);
  return ((iVar3 - (iVar2 + ((weekday - iVar1) + 7) % 7)) + 7) / 7;
}

Assistant:

int weekno(int weekday) const
    {
        /* 
         *   Figure days until the first <weekday> of the year: that's the
         *   start of week 1, so the day number of the start of week 1 is the
         *   jan1 day number plus this delta.  The start of week 0 is 7 days
         *   before that.
         */
        caldate_t jan1(jan1_dayno());
        int delta = (7 + weekday - jan1.weekday()) % 7;
        int week0_dayno = jan1.dayno() + delta - 7;

        /* figure which week we're in and return the result */
        return (dayno() - week0_dayno)/7;
    }